

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::clear_all(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
            *this)

{
  reference_counter_type *prVar1;
  timer_type *ptVar2;
  timer_type *ptVar3;
  
  ptVar2 = this->m_head;
  while (ptVar3 = ptVar2, ptVar3 != (timer_type *)0x0) {
    ptVar2 = ptVar3->m_next;
    this->m_head = ptVar2;
    *(undefined4 *)&(ptVar3->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
    prVar1 = &(ptVar3->super_timer_object<timertt::thread_safety::unsafe>).m_references;
    *prVar1 = *prVar1 - 1;
    if (*prVar1 == 0) {
      (*(ptVar3->super_timer_object<timertt::thread_safety::unsafe>)._vptr_timer_object[1])();
      ptVar2 = this->m_head;
    }
  }
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_single_shot_count = 0;
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_periodic_count = 0;
  this->m_tail = (timer_type *)0x0;
  return;
}

Assistant:

void
	clear_all()
	{
		while( m_head )
		{
			auto t = m_head;
			m_head = m_head->m_next;

			t->m_status = timer_status::deactivated;
			timer_object< THREAD_SAFETY >::decrement_references( t );
		}

		// There are no more timers in the list.
		this->reset_timer_count();
		m_tail = nullptr;
	}